

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *val,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *maxabs,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *update,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lowBound,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *upBound,int start,int incr)

{
  cpp_dec_float<200u,int,void> *this_00;
  Type TVar1;
  int iVar2;
  pointer pnVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  SPxId *pSVar5;
  type_conflict5 tVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar14;
  byte bVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  uint *puVar17;
  pointer pnVar18;
  cpp_dec_float<200u,int,void> *pcVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  uint *puVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar25;
  int32_t iVar26;
  fpclass_type fVar27;
  int *piVar28;
  bool bVar29;
  byte bVar30;
  ulong uVar31;
  long local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_41c;
  int *local_418;
  long local_3f8;
  cpp_dec_float<200U,_int,_void> local_3e8;
  pointer local_368;
  fpclass_type *local_360;
  fpclass_type *local_358;
  cpp_dec_float<200u,int,void> *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  cpp_dec_float<200U,_int,_void> local_238;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar30 = 0;
  local_3e8.fpclass = cpp_dec_float_finite;
  local_3e8.prec_elem = 0x1c;
  local_3e8.data._M_elems[0] = 0;
  local_3e8.data._M_elems[1] = 0;
  local_3e8.data._M_elems[2] = 0;
  local_3e8.data._M_elems[3] = 0;
  local_3e8.data._M_elems[4] = 0;
  local_3e8.data._M_elems[5] = 0;
  local_3e8.data._M_elems[6] = 0;
  local_3e8.data._M_elems[7] = 0;
  local_3e8.data._M_elems[8] = 0;
  local_3e8.data._M_elems[9] = 0;
  local_3e8.data._M_elems[10] = 0;
  local_3e8.data._M_elems[0xb] = 0;
  local_3e8.data._M_elems[0xc] = 0;
  local_3e8.data._M_elems[0xd] = 0;
  local_3e8.data._M_elems[0xe] = 0;
  local_3e8.data._M_elems[0xf] = 0;
  local_3e8.data._M_elems[0x10] = 0;
  local_3e8.data._M_elems[0x11] = 0;
  local_3e8.data._M_elems[0x12] = 0;
  local_3e8.data._M_elems[0x13] = 0;
  local_3e8.data._M_elems[0x18] = 0;
  local_3e8.data._M_elems[0x19] = 0;
  local_3e8.data._M_elems._104_5_ = 0;
  local_3e8.data._M_elems[0x1b]._1_3_ = 0;
  local_3e8.exp = 0;
  local_3e8.neg = false;
  local_3e8.data._M_elems[0x14] = 0;
  local_3e8.data._M_elems[0x15] = 0;
  local_3e8.data._M_elems[0x16] = 0;
  local_3e8.data._M_elems[0x17] = 0;
  local_238.fpclass = cpp_dec_float_finite;
  local_238.prec_elem = 0x1c;
  local_238.data._M_elems[0] = 0;
  local_238.data._M_elems[1] = 0;
  local_238.data._M_elems[2] = 0;
  local_238.data._M_elems[3] = 0;
  local_238.data._M_elems[4] = 0;
  local_238.data._M_elems[5] = 0;
  local_238.data._M_elems[6] = 0;
  local_238.data._M_elems[7] = 0;
  local_238.data._M_elems[8] = 0;
  local_238.data._M_elems[9] = 0;
  local_238.data._M_elems[10] = 0;
  local_238.data._M_elems[0xb] = 0;
  local_238.data._M_elems[0xc] = 0;
  local_238.data._M_elems[0xd] = 0;
  local_238.data._M_elems[0xe] = 0;
  local_238.data._M_elems[0xf] = 0;
  local_238.data._M_elems[0x10] = 0;
  local_238.data._M_elems[0x11] = 0;
  local_238.data._M_elems[0x12] = 0;
  local_238.data._M_elems[0x13] = 0;
  local_238.data._M_elems[0x14] = 0;
  local_238.data._M_elems[0x15] = 0;
  local_238.data._M_elems[0x16] = 0;
  local_238.data._M_elems[0x17] = 0;
  local_238.data._M_elems[0x18] = 0;
  local_238.data._M_elems[0x19] = 0;
  local_238.data._M_elems._104_5_ = 0;
  local_238.data._M_elems[0x1b]._1_3_ = 0;
  local_238.exp = 0;
  local_238.neg = false;
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 0x1c;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems[6] = 0;
  local_1b8.data._M_elems[7] = 0;
  local_1b8.data._M_elems[8] = 0;
  local_1b8.data._M_elems[9] = 0;
  local_1b8.data._M_elems[10] = 0;
  local_1b8.data._M_elems[0xb] = 0;
  local_1b8.data._M_elems[0xc] = 0;
  local_1b8.data._M_elems[0xd] = 0;
  local_1b8.data._M_elems[0xe] = 0;
  local_1b8.data._M_elems[0xf] = 0;
  local_1b8.data._M_elems[0x18] = 0;
  local_1b8.data._M_elems[0x19] = 0;
  local_1b8.data._M_elems._104_5_ = 0;
  local_1b8.data._M_elems[0x1b]._1_3_ = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  local_1b8.data._M_elems[0x10] = 0;
  local_1b8.data._M_elems[0x11] = 0;
  local_1b8.data._M_elems[0x12] = 0;
  local_1b8.data._M_elems[0x13] = 0;
  local_1b8.data._M_elems[0x14] = 0;
  local_1b8.data._M_elems[0x15] = 0;
  local_1b8.data._M_elems[0x16] = 0;
  local_1b8.data._M_elems[0x17] = 0;
  TVar1 = (this->
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_type;
  if (TVar1 == LEAVE) {
    bVar29 = false;
  }
  else {
    bVar29 = ((this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->theRep == ROW;
  }
  lVar12 = 0x1c;
  puVar17 = (uint *)maxabs;
  pcVar23 = &local_2c8;
  for (lVar11 = lVar12; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pcVar23->data)._M_elems[0] = *puVar17;
    puVar17 = puVar17 + 1;
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((pcVar23->data)._M_elems + 1);
  }
  local_2c8.exp = (maxabs->m_backend).exp;
  local_2c8.neg = (maxabs->m_backend).neg;
  local_240 = maxabs;
  local_2c8.fpclass = (maxabs->m_backend).fpclass;
  local_2c8.prec_elem = (maxabs->m_backend).prec_elem;
  local_360 = (fpclass_type *)
              (upBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_358 = (fpclass_type *)
              (lowBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_368 = (update->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_418 = (update->thedelta).super_IdxSet.idx;
  pnVar3 = (update->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar17 = (uint *)val;
  puVar22 = (uint *)&local_b0;
  for (; lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar22 = *puVar17;
    puVar17 = puVar17 + 1;
    puVar22 = puVar22 + 1;
  }
  local_b0.m_backend.exp = (val->m_backend).exp;
  local_b0.m_backend.neg = (val->m_backend).neg;
  local_248 = val;
  local_b0.m_backend.fpclass = (val->m_backend).fpclass;
  local_b0.m_backend.prec_elem = (val->m_backend).prec_elem;
  if ((update->thedelta).setupStatus == true) {
    iVar9 = (update->thedelta).super_IdxSet.num;
    piVar28 = local_418 + start;
    pnVar24 = &this->fastDelta;
    local_350 = (cpp_dec_float<200u,int,void> *)((long)incr << 2);
    local_41c = -1;
    while( true ) {
      lVar12 = 0x1c;
      if (local_418 + iVar9 <= piVar28) break;
      iVar2 = *piVar28;
      pnVar18 = pnVar3 + iVar2;
      pcVar23 = &local_3e8;
      for (; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pcVar23->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
        pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
        pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4);
      }
      local_3e8.exp = pnVar3[iVar2].m_backend.exp;
      local_3e8.neg = pnVar3[iVar2].m_backend.neg;
      local_3e8.fpclass = pnVar3[iVar2].m_backend.fpclass;
      local_3e8.prec_elem = pnVar3[iVar2].m_backend.prec_elem;
      if (TVar1 == LEAVE) {
        pSVar4 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        if (this->iscoid == true) {
          pDVar14 = (pSVar4->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.costat;
        }
        else {
          pDVar14 = (pSVar4->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.stat;
        }
        if (pSVar4->theRep * pDVar14->data[iVar2] < 1) goto LAB_00452012;
      }
      else {
LAB_00452012:
        if (bVar29) {
          pSVar4 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar5 = (pSVar4->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < pSVar5[iVar2].super_DataKey.info) {
            SPxColId::SPxColId((SPxColId *)&result,pSVar5 + iVar2);
            iVar8 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                    ::number(&(pSVar4->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set,(DataKey *)&result);
            if ((pSVar4->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar8] == P_FIXED) goto LAB_00452924;
          }
        }
        lVar11 = 0x1c;
        pnVar16 = &this->epsilon;
        pcVar23 = &result.m_backend;
        for (lVar12 = lVar11; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pcVar23->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + (ulong)bVar30 * -8 + 4);
          pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4);
        }
        result.m_backend.exp = (this->epsilon).m_backend.exp;
        result.m_backend.neg = (this->epsilon).m_backend.neg;
        result.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
        result.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
        tVar6 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_3e8,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result.m_backend);
        pnVar16 = &this->epsilon;
        pcVar23 = &result.m_backend;
        if (tVar6) {
          pcVar23 = &local_2c8;
          tVar6 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_3e8,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar23);
          lVar12 = lVar11;
          pcVar20 = pcVar23;
          if (tVar6) {
            pcVar20 = &local_3e8;
          }
          for (; lVar12 != 0; lVar12 = lVar12 + -1) {
            (((cpp_dec_float<200U,_int,_void> *)&pcVar23->data)->data)._M_elems[0] =
                 (((cpp_dec_float<200U,_int,_void> *)&pcVar20->data)->data)._M_elems[0];
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar20 + ((ulong)bVar30 * -2 + 1) * 4);
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar23 + ((ulong)bVar30 * -2 + 1) * 4);
          }
          pcVar23 = &local_2c8;
          if (tVar6) {
            pcVar23 = &local_3e8;
          }
          local_2c8.exp = pcVar23->exp;
          pcVar23 = &local_2c8;
          if (tVar6) {
            pcVar23 = &local_3e8;
          }
          local_2c8.neg = pcVar23->neg;
          uVar31 = CONCAT44((int)((uint)tVar6 << 0x1f) >> 0x1f,(int)((uint)tVar6 << 0x1f) >> 0x1f);
          local_2c8._120_8_ = ~uVar31 & local_2c8._120_8_ | local_3e8._120_8_ & uVar31;
          pnVar18 = (pointer)((long)local_358 + (long)iVar2 * 0x80);
          pcVar23 = &local_1b8;
          for (lVar12 = lVar11; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pcVar23->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
            pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4);
          }
          local_1b8.exp = (((pointer)((long)local_358 + (long)iVar2 * 0x80))->m_backend).exp;
          local_1b8.neg = (((pointer)((long)local_358 + (long)iVar2 * 0x80))->m_backend).neg;
          local_1b8.fpclass = (((pointer)((long)local_358 + (long)iVar2 * 0x80))->m_backend).fpclass
          ;
          local_1b8.prec_elem =
               (((pointer)((long)local_358 + (long)iVar2 * 0x80))->m_backend).prec_elem;
          pdVar10 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&result.m_backend,-*pdVar10,(type *)0x0);
          tVar6 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1b8,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result.m_backend);
          if (tVar6) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,&local_1b8,&local_368[iVar2].m_backend);
            pcVar23 = &result.m_backend;
            pcVar20 = &local_238;
            for (lVar12 = lVar11; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pcVar20->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar30 * -8 + 4);
            }
            local_238.exp = result.m_backend.exp;
            local_238.neg = result.m_backend.neg;
            local_238.fpclass = result.m_backend.fpclass;
            local_238.prec_elem = result.m_backend.prec_elem;
            result.m_backend.data._M_elems._0_8_ =
                 result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
            tVar6 = boost::multiprecision::operator>=
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_238,(int *)&result.m_backend);
            if (tVar6) {
              pnVar16 = pnVar24;
              pcVar23 = &result_1.m_backend;
              for (; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar23->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
                pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar16 + (ulong)bVar30 * -8 + 4);
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4)
                ;
              }
              result_1.m_backend.exp = (this->fastDelta).m_backend.exp;
              result_1.m_backend.neg = (this->fastDelta).m_backend.neg;
              result_1.m_backend.fpclass = (this->fastDelta).m_backend.fpclass;
              result_1.m_backend.prec_elem = (this->fastDelta).m_backend.prec_elem;
              if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
                  result_1.m_backend.data._M_elems[0] != 0) {
                result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
              }
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,&result_1.m_backend,&local_3e8);
              pcVar23 = &result.m_backend;
              pcVar20 = &local_3e8;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pcVar20->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4)
                ;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar30 * -8 + 4)
                ;
              }
            }
            else {
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 0x1c;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.data._M_elems[10] = 0;
              result_1.m_backend.data._M_elems[0xb] = 0;
              result_1.m_backend.data._M_elems[0xc] = 0;
              result_1.m_backend.data._M_elems[0xd] = 0;
              result_1.m_backend.data._M_elems[0xe] = 0;
              result_1.m_backend.data._M_elems[0xf] = 0;
              result_1.m_backend.data._M_elems[0x10] = 0;
              result_1.m_backend.data._M_elems[0x11] = 0;
              result_1.m_backend.data._M_elems[0x12] = 0;
              result_1.m_backend.data._M_elems[0x13] = 0;
              result_1.m_backend.data._M_elems[0x14] = 0;
              result_1.m_backend.data._M_elems[0x15] = 0;
              result_1.m_backend.data._M_elems[0x16] = 0;
              result_1.m_backend.data._M_elems[0x17] = 0;
              result_1.m_backend.data._M_elems[0x18] = 0;
              result_1.m_backend.data._M_elems[0x19] = 0;
              result_1.m_backend.data._M_elems._104_5_ = 0;
              result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_1.m_backend,&local_238,&pnVar24->m_backend);
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,&result_1.m_backend,&local_3e8);
              pcVar23 = &result.m_backend;
              pcVar20 = &local_3e8;
              for (; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar20->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4)
                ;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar30 * -8 + 4)
                ;
              }
            }
            local_3e8.exp = result.m_backend.exp;
            local_3e8.neg = result.m_backend.neg;
            local_3e8._120_8_ = result.m_backend._120_8_;
            tVar6 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_3e8,&local_b0);
            if (tVar6) {
LAB_004528da:
              pcVar23 = &local_3e8;
              pnVar16 = &local_b0;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pnVar16->m_backend).data._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4)
                ;
                pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar16 + ((ulong)bVar30 * -2 + 1) * 4);
              }
              local_b0.m_backend.exp = local_3e8.exp;
              local_b0.m_backend.neg = local_3e8.neg;
              local_b0.m_backend.fpclass = local_3e8.fpclass;
              local_b0.m_backend.prec_elem = local_3e8.prec_elem;
              local_41c = iVar2;
            }
          }
        }
        else {
          for (; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar23->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
            pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar16 + (ulong)bVar30 * -8 + 4);
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4);
          }
          result.m_backend.exp = (this->epsilon).m_backend.exp;
          result.m_backend.neg = (this->epsilon).m_backend.neg;
          result.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
          result.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
          if (result.m_backend.fpclass != cpp_dec_float_finite ||
              result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
          }
          tVar6 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_3e8,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result.m_backend);
          if (tVar6) {
            pcVar23 = &local_3e8;
            pcVar20 = &result.m_backend;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pcVar20->data)._M_elems[0] =
                   (((cpp_dec_float<200U,_int,_void> *)&pcVar23->data)->data)._M_elems[0];
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar23 + ((ulong)bVar30 * -2 + 1) * 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar30 * -8 + 4);
            }
            result.m_backend.exp = local_3e8.exp;
            result.m_backend.neg = local_3e8.neg;
            result.m_backend.fpclass = local_3e8.fpclass;
            result.m_backend.prec_elem = local_3e8.prec_elem;
            if (local_3e8.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
            {
              result.m_backend.neg = (bool)(local_3e8.neg ^ 1);
            }
            tVar6 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result.m_backend,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_2c8);
            if (tVar6) {
              puVar17 = local_3e8.data._M_elems + 1;
              pnVar16 = &result_1;
              for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pnVar16->m_backend).data._M_elems[0] = *puVar17;
                puVar17 = puVar17 + (ulong)bVar30 * -2 + 1;
                pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar16 + ((ulong)bVar30 * -2 + 1) * 4);
              }
              local_2c8.data._M_elems[0] = 0;
              iVar8 = local_3e8.exp;
              iVar26 = local_3e8.prec_elem;
              if (local_3e8.fpclass == cpp_dec_float_finite && local_3e8.data._M_elems[0] == 0) {
                bVar15 = local_3e8.neg;
                fVar27 = cpp_dec_float_finite;
              }
              else {
                bVar15 = local_3e8.neg ^ 1;
                local_2c8.data._M_elems[0] = local_3e8.data._M_elems[0];
                fVar27 = local_3e8.fpclass;
              }
            }
            else {
              puVar17 = local_2c8.data._M_elems + 1;
              pnVar16 = &result_1;
              for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pnVar16->m_backend).data._M_elems[0] = *puVar17;
                puVar17 = puVar17 + (ulong)bVar30 * -2 + 1;
                pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar16 + ((ulong)bVar30 * -2 + 1) * 4);
              }
              iVar8 = local_2c8.exp;
              bVar15 = local_2c8.neg;
              iVar26 = local_2c8.prec_elem;
              fVar27 = local_2c8.fpclass;
            }
            pnVar16 = &result_1;
            puVar17 = local_2c8.data._M_elems + 1;
            for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
              *puVar17 = (pnVar16->m_backend).data._M_elems[0];
              pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar16 + ((ulong)bVar30 * -2 + 1) * 4);
              puVar17 = puVar17 + (ulong)bVar30 * -2 + 1;
            }
            local_2c8.prec_elem = iVar26;
            local_2c8.fpclass = fVar27;
            pnVar18 = (pointer)((long)local_360 + (long)iVar2 * 0x80);
            pcVar23 = &local_138;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pcVar23->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
              pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4);
            }
            local_138.exp = (((pointer)((long)local_360 + (long)iVar2 * 0x80))->m_backend).exp;
            local_138.neg = (((pointer)((long)local_360 + (long)iVar2 * 0x80))->m_backend).neg;
            local_138.fpclass =
                 (((pointer)((long)local_360 + (long)iVar2 * 0x80))->m_backend).fpclass;
            local_138.prec_elem =
                 (((pointer)((long)local_360 + (long)iVar2 * 0x80))->m_backend).prec_elem;
            local_2c8.exp = iVar8;
            local_2c8.neg = (bool)bVar15;
            pdVar10 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result.m_backend,*pdVar10,(type *)0x0);
            tVar6 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_138,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result.m_backend);
            if (tVar6) {
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,&local_138,&local_368[iVar2].m_backend);
              lVar12 = 0x1c;
              pcVar23 = &result.m_backend;
              pcVar20 = &local_238;
              for (lVar11 = lVar12; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar20->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4)
                ;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar30 * -8 + 4)
                ;
              }
              local_238.exp = result.m_backend.exp;
              local_238.neg = result.m_backend.neg;
              local_238.fpclass = result.m_backend.fpclass;
              local_238.prec_elem = result.m_backend.prec_elem;
              result.m_backend.data._M_elems._0_8_ =
                   result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
              tVar6 = boost::multiprecision::operator<=
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_238,(int *)&result.m_backend);
              pcVar23 = &pnVar24->m_backend;
              if (!tVar6) {
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 0x1c;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.data._M_elems[10] = 0;
                result_1.m_backend.data._M_elems[0xb] = 0;
                result_1.m_backend.data._M_elems[0xc] = 0;
                result_1.m_backend.data._M_elems[0xd] = 0;
                result_1.m_backend.data._M_elems[0xe] = 0;
                result_1.m_backend.data._M_elems[0xf] = 0;
                result_1.m_backend.data._M_elems[0x10] = 0;
                result_1.m_backend.data._M_elems[0x11] = 0;
                result_1.m_backend.data._M_elems[0x12] = 0;
                result_1.m_backend.data._M_elems[0x13] = 0;
                result_1.m_backend.data._M_elems[0x14] = 0;
                result_1.m_backend.data._M_elems[0x15] = 0;
                result_1.m_backend.data._M_elems[0x16] = 0;
                result_1.m_backend.data._M_elems[0x17] = 0;
                result_1.m_backend.data._M_elems[0x18] = 0;
                result_1.m_backend.data._M_elems[0x19] = 0;
                result_1.m_backend.data._M_elems._104_5_ = 0;
                result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (&result_1.m_backend,&local_238,&pnVar24->m_backend);
                pcVar23 = &result_1.m_backend;
              }
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.neg = false;
              result.m_backend.exp = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,pcVar23,&local_3e8);
              pcVar23 = &result.m_backend;
              pcVar20 = &local_3e8;
              for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pcVar20->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4)
                ;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar30 * -8 + 4)
                ;
              }
              local_3e8.exp = result.m_backend.exp;
              local_3e8.neg = result.m_backend.neg;
              local_3e8.fpclass = result.m_backend.fpclass;
              local_3e8.prec_elem = result.m_backend.prec_elem;
              tVar6 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_3e8,&local_b0);
              if (tVar6) goto LAB_004528da;
            }
          }
        }
      }
LAB_00452924:
      piVar28 = (int *)((long)piVar28 + (long)local_350);
    }
  }
  else {
    local_41c = -1;
    (update->thedelta).setupStatus = false;
    local_350 = (cpp_dec_float<200u,int,void> *)
                (pnVar3 + (int)((ulong)((long)(update->
                                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              ).val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_368) >> 7));
    pnVar24 = &this->epsilon;
    pnVar16 = &this->fastDelta;
    local_358 = &(((pointer)local_358)->m_backend).fpclass;
    local_360 = &(((pointer)local_360)->m_backend).fpclass;
    lVar12 = 0;
    local_3f8 = 0;
    local_4b0 = 0;
    while( true ) {
      lVar11 = 0x1c;
      this_00 = (cpp_dec_float<200u,int,void> *)((long)&(pnVar3->m_backend).data + lVar12);
      if (local_350 <= this_00) break;
      pcVar19 = this_00;
      pcVar23 = &local_3e8;
      for (lVar13 = lVar11; lVar13 != 0; lVar13 = lVar13 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar23->data)->data)._M_elems[0] = *(uint *)pcVar19;
        pcVar19 = pcVar19 + (ulong)bVar30 * -8 + 4;
        pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar30 * -2 + 1) * 4);
      }
      local_3e8.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar12 + 0x70);
      local_3e8.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar12 + 0x74);
      local_3e8._120_8_ = *(ulong *)((long)&(pnVar3->m_backend).data + lVar12 + 0x78);
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      tVar6 = boost::multiprecision::operator!=
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_3e8,(double *)&result);
      pnVar21 = pnVar24;
      pnVar25 = &result;
      if (tVar6) {
        for (; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pnVar25->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
          pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar21 + (ulong)bVar30 * -8 + 4);
          pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar25 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        result.m_backend.exp = (this->epsilon).m_backend.exp;
        result.m_backend.neg = (this->epsilon).m_backend.neg;
        result.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
        result.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
        if (result.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
        }
        tVar6 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_3e8,&result);
        if (tVar6) {
          pnVar21 = pnVar24;
          pnVar25 = &result_1;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar25->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + (ulong)bVar30 * -8 + 4);
            pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar25 + ((ulong)bVar30 * -2 + 1) * 4);
          }
          result_1.m_backend.exp = (this->epsilon).m_backend.exp;
          result_1.m_backend.neg = (this->epsilon).m_backend.neg;
          result_1.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
          result_1.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
          tVar6 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_3e8,&result_1);
          if (tVar6) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(this_00,0.0);
            goto LAB_00453437;
          }
        }
        piVar28 = local_418 + 1;
        *local_418 = (int)local_4b0;
        local_418 = piVar28;
        if (TVar1 == LEAVE) {
          pSVar4 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          if (this->iscoid == true) {
            pDVar14 = (pSVar4->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat;
          }
          else {
            pDVar14 = (pSVar4->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat;
          }
          if (0 < pSVar4->theRep * pDVar14->data[local_4b0]) goto LAB_00453437;
        }
        if (bVar29) {
          pSVar4 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar5 = (pSVar4->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < *(int *)((long)&(pSVar5->super_DataKey).info + local_3f8)) {
            SPxColId::SPxColId((SPxColId *)&result,
                               (SPxId *)((long)&(pSVar5->super_DataKey).info + local_3f8));
            iVar9 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                    ::number(&(pSVar4->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set,(DataKey *)&result);
            if ((pSVar4->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar9] == P_FIXED) goto LAB_00453437;
          }
        }
        lVar11 = 0x1c;
        pnVar21 = pnVar24;
        pnVar25 = &result;
        for (lVar13 = lVar11; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pnVar25->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
          pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar21 + (ulong)bVar30 * -8 + 4);
          pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar25 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        result.m_backend.exp = (this->epsilon).m_backend.exp;
        result.m_backend.neg = (this->epsilon).m_backend.neg;
        result.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
        result.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
        tVar6 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_3e8,&result);
        if (tVar6) {
          pcVar23 = &local_2c8;
          tVar6 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_3e8,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar23);
          lVar13 = lVar11;
          pcVar20 = pcVar23;
          if (tVar6) {
            pcVar20 = &local_3e8;
          }
          for (; lVar13 != 0; lVar13 = lVar13 + -1) {
            (((cpp_dec_float<200U,_int,_void> *)&pcVar23->data)->data)._M_elems[0] =
                 (((cpp_dec_float<200U,_int,_void> *)&pcVar20->data)->data)._M_elems[0];
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar20 + ((ulong)bVar30 * -2 + 1) * 4);
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar23 + ((ulong)bVar30 * -2 + 1) * 4);
          }
          pcVar23 = &local_2c8;
          if (tVar6) {
            pcVar23 = &local_3e8;
          }
          local_2c8.exp = pcVar23->exp;
          pcVar23 = &local_2c8;
          if (tVar6) {
            pcVar23 = &local_3e8;
          }
          local_2c8.neg = pcVar23->neg;
          uVar31 = CONCAT44((int)((uint)tVar6 << 0x1f) >> 0x1f,(int)((uint)tVar6 << 0x1f) >> 0x1f);
          local_2c8._120_8_ = ~uVar31 & local_2c8._120_8_ | local_3e8._120_8_ & uVar31;
          puVar17 = (uint *)((long)local_358 + lVar12 + -0x78);
          puVar22 = puVar17;
          pcVar23 = &local_1b8;
          for (lVar13 = lVar11; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar23->data)._M_elems[0] = *puVar22;
            puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4);
          }
          local_1b8.exp = puVar17[0x1c];
          local_1b8.neg = SUB41(puVar17[0x1d],0);
          local_1b8.fpclass = puVar17[0x1e];
          local_1b8.prec_elem = puVar17[0x1f];
          pdVar10 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&result.m_backend,-*pdVar10,(type *)0x0);
          tVar6 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1b8,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result.m_backend);
          if (tVar6) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,&local_1b8,
                       (cpp_dec_float<200U,_int,_void> *)((long)&local_368->m_backend + lVar12));
            pcVar23 = &result.m_backend;
            pcVar20 = &local_238;
            for (lVar13 = lVar11; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar20->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar30 * -8 + 4);
            }
            local_238.exp = result.m_backend.exp;
            local_238.neg = result.m_backend.neg;
            local_238.fpclass = result.m_backend.fpclass;
            local_238.prec_elem = result.m_backend.prec_elem;
            result.m_backend.data._M_elems._0_8_ =
                 result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
            tVar6 = boost::multiprecision::operator>=
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_238,(int *)&result.m_backend);
            if (tVar6) {
              pnVar21 = pnVar16;
              pcVar23 = &result_1.m_backend;
              for (; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar23->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
                pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar21 + (ulong)bVar30 * -8 + 4);
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4)
                ;
              }
              result_1.m_backend.exp = (this->fastDelta).m_backend.exp;
              result_1.m_backend.neg = (this->fastDelta).m_backend.neg;
              result_1.m_backend.fpclass = (this->fastDelta).m_backend.fpclass;
              result_1.m_backend.prec_elem = (this->fastDelta).m_backend.prec_elem;
              if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
                  result_1.m_backend.data._M_elems[0] != 0) {
                result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
              }
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,&result_1.m_backend,&local_3e8);
              lVar11 = 0x1c;
              pcVar23 = &result.m_backend;
              pcVar20 = &local_3e8;
            }
            else {
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 0x1c;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.data._M_elems[10] = 0;
              result_1.m_backend.data._M_elems[0xb] = 0;
              result_1.m_backend.data._M_elems[0xc] = 0;
              result_1.m_backend.data._M_elems[0xd] = 0;
              result_1.m_backend.data._M_elems[0xe] = 0;
              result_1.m_backend.data._M_elems[0xf] = 0;
              result_1.m_backend.data._M_elems[0x10] = 0;
              result_1.m_backend.data._M_elems[0x11] = 0;
              result_1.m_backend.data._M_elems[0x12] = 0;
              result_1.m_backend.data._M_elems[0x13] = 0;
              result_1.m_backend.data._M_elems[0x14] = 0;
              result_1.m_backend.data._M_elems[0x15] = 0;
              result_1.m_backend.data._M_elems[0x16] = 0;
              result_1.m_backend.data._M_elems[0x17] = 0;
              result_1.m_backend.data._M_elems[0x18] = 0;
              result_1.m_backend.data._M_elems[0x19] = 0;
              result_1.m_backend.data._M_elems._104_5_ = 0;
              result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_1.m_backend,&local_238,&pnVar16->m_backend);
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              pcVar23 = &result.m_backend;
              pcVar20 = &local_3e8;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (pcVar23,&result_1.m_backend,pcVar20);
            }
            for (; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pcVar20->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar30 * -8 + 4);
            }
            local_3e8.exp = result.m_backend.exp;
            local_3e8.neg = result.m_backend.neg;
            local_3e8.fpclass = result.m_backend.fpclass;
            local_3e8.prec_elem = result.m_backend.prec_elem;
            bVar7 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_3e8,&local_b0);
joined_r0x00453424:
            if (bVar7) {
              pcVar23 = &local_3e8;
              pnVar21 = &local_b0;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pnVar21->m_backend).data._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4)
                ;
                pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar21 + ((ulong)bVar30 * -2 + 1) * 4);
              }
              local_b0.m_backend.exp = local_3e8.exp;
              local_b0.m_backend.neg = local_3e8.neg;
              local_b0.m_backend.fpclass = local_3e8.fpclass;
              local_b0.m_backend.prec_elem = local_3e8.prec_elem;
              local_41c = (int)local_4b0;
            }
          }
        }
        else {
          pnVar21 = pnVar24;
          pnVar25 = &result;
          for (; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar25->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + (ulong)bVar30 * -8 + 4);
            pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar25 + ((ulong)bVar30 * -2 + 1) * 4);
          }
          result.m_backend.exp = (this->epsilon).m_backend.exp;
          result.m_backend.neg = (this->epsilon).m_backend.neg;
          result.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
          result.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
          if (result.m_backend.fpclass != cpp_dec_float_finite ||
              result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
          }
          tVar6 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_3e8,&result);
          if (tVar6) {
            pcVar23 = &local_3e8;
            pnVar21 = &result;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pnVar21->m_backend).data._M_elems[0] =
                   (((cpp_dec_float<200U,_int,_void> *)&pcVar23->data)->data)._M_elems[0];
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar23 + ((ulong)bVar30 * -2 + 1) * 4);
              pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar21 + ((ulong)bVar30 * -2 + 1) * 4);
            }
            result.m_backend.exp = local_3e8.exp;
            result.m_backend.neg = local_3e8.neg;
            result.m_backend.fpclass = local_3e8.fpclass;
            result.m_backend.prec_elem = local_3e8.prec_elem;
            puVar17 = local_2c8.data._M_elems + 1;
            lVar11 = 0x1b;
            if (local_3e8.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
            {
              result.m_backend.neg = (bool)(local_3e8.neg ^ 1);
            }
            tVar6 = boost::multiprecision::operator>
                              (&result,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_2c8);
            lVar13 = lVar11;
            puVar22 = puVar17;
            pnVar21 = &result_1;
            if (tVar6) {
              puVar22 = local_3e8.data._M_elems + 1;
              for (; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pnVar21->m_backend).data._M_elems[0] = *puVar22;
                puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
                pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar21 + ((ulong)bVar30 * -2 + 1) * 4);
              }
              iVar9 = local_3e8.exp;
              iVar26 = local_3e8.prec_elem;
              if (local_3e8.fpclass == cpp_dec_float_finite && local_3e8.data._M_elems[0] == 0) {
                bVar15 = local_3e8.neg;
                local_2c8.data._M_elems[0] = 0;
                fVar27 = cpp_dec_float_finite;
              }
              else {
                bVar15 = local_3e8.neg ^ 1;
                local_2c8.data._M_elems[0] = local_3e8.data._M_elems[0];
                fVar27 = local_3e8.fpclass;
              }
            }
            else {
              for (; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pnVar21->m_backend).data._M_elems[0] = *puVar22;
                puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
                pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar21 + ((ulong)bVar30 * -2 + 1) * 4);
              }
              fVar27 = local_2c8.fpclass;
              iVar9 = local_2c8.exp;
              bVar15 = local_2c8.neg;
              iVar26 = local_2c8.prec_elem;
            }
            pnVar21 = &result_1;
            for (; lVar11 != 0; lVar11 = lVar11 + -1) {
              *puVar17 = (pnVar21->m_backend).data._M_elems[0];
              pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar21 + ((ulong)bVar30 * -2 + 1) * 4);
              puVar17 = puVar17 + (ulong)bVar30 * -2 + 1;
            }
            local_2c8.prec_elem = iVar26;
            local_2c8.fpclass = fVar27;
            puVar17 = (uint *)((long)local_360 + lVar12 + -0x78);
            lVar11 = 0x1c;
            puVar22 = puVar17;
            pcVar23 = &local_138;
            for (lVar13 = lVar11; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar23->data)._M_elems[0] = *puVar22;
              puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4);
            }
            local_138.exp = puVar17[0x1c];
            local_138.neg = SUB41(puVar17[0x1d],0);
            local_138.fpclass = puVar17[0x1e];
            local_138.prec_elem = puVar17[0x1f];
            local_2c8.exp = iVar9;
            local_2c8.neg = (bool)bVar15;
            pdVar10 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result.m_backend,*pdVar10,(type *)0x0);
            tVar6 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_138,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result.m_backend);
            if (tVar6) {
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,&local_138,
                         (cpp_dec_float<200U,_int,_void> *)((long)&local_368->m_backend + lVar12));
              pcVar23 = &result.m_backend;
              pcVar20 = &local_238;
              for (lVar13 = lVar11; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar20->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4)
                ;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar30 * -8 + 4)
                ;
              }
              local_238.exp = result.m_backend.exp;
              local_238.neg = result.m_backend.neg;
              local_238.fpclass = result.m_backend.fpclass;
              local_238.prec_elem = result.m_backend.prec_elem;
              result.m_backend.data._M_elems._0_8_ =
                   result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
              tVar6 = boost::multiprecision::operator<=
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_238,(int *)&result.m_backend);
              pcVar23 = &pnVar16->m_backend;
              if (!tVar6) {
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 0x1c;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.data._M_elems[10] = 0;
                result_1.m_backend.data._M_elems[0xb] = 0;
                result_1.m_backend.data._M_elems[0xc] = 0;
                result_1.m_backend.data._M_elems[0xd] = 0;
                result_1.m_backend.data._M_elems[0xe] = 0;
                result_1.m_backend.data._M_elems[0xf] = 0;
                result_1.m_backend.data._M_elems[0x10] = 0;
                result_1.m_backend.data._M_elems[0x11] = 0;
                result_1.m_backend.data._M_elems[0x12] = 0;
                result_1.m_backend.data._M_elems[0x13] = 0;
                result_1.m_backend.data._M_elems[0x14] = 0;
                result_1.m_backend.data._M_elems[0x15] = 0;
                result_1.m_backend.data._M_elems[0x16] = 0;
                result_1.m_backend.data._M_elems[0x17] = 0;
                result_1.m_backend.data._M_elems[0x18] = 0;
                result_1.m_backend.data._M_elems[0x19] = 0;
                result_1.m_backend.data._M_elems._104_5_ = 0;
                result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (&result_1.m_backend,&local_238,&pnVar16->m_backend);
                pcVar23 = &result_1.m_backend;
              }
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.neg = false;
              result.m_backend.exp = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,pcVar23,&local_3e8);
              pcVar23 = &result.m_backend;
              pcVar20 = &local_3e8;
              for (; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar20->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4)
                ;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar30 * -8 + 4)
                ;
              }
              local_3e8.exp = result.m_backend.exp;
              local_3e8.neg = result.m_backend.neg;
              local_3e8.fpclass = result.m_backend.fpclass;
              local_3e8.prec_elem = result.m_backend.prec_elem;
              bVar7 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_3e8,&local_b0);
              goto joined_r0x00453424;
            }
          }
        }
      }
LAB_00453437:
      local_4b0 = local_4b0 + 1;
      local_3f8 = local_3f8 + 8;
      lVar12 = lVar12 + 0x80;
    }
    (update->thedelta).super_IdxSet.num =
         (int)((ulong)((long)local_418 - (long)(update->thedelta).super_IdxSet.idx) >> 2);
    (update->thedelta).setupStatus = true;
  }
  lVar12 = 0x1c;
  pnVar24 = &local_b0;
  pnVar16 = local_248;
  for (lVar11 = lVar12; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pnVar16->m_backend).data._M_elems[0] = (pnVar24->m_backend).data._M_elems[0];
    pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar24 + ((ulong)bVar30 * -2 + 1) * 4);
    pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar16 + ((ulong)bVar30 * -2 + 1) * 4);
  }
  (local_248->m_backend).exp = local_b0.m_backend.exp;
  (local_248->m_backend).neg = local_b0.m_backend.neg;
  (local_248->m_backend).fpclass = local_b0.m_backend.fpclass;
  (local_248->m_backend).prec_elem = local_b0.m_backend.prec_elem;
  pcVar23 = &local_2c8;
  pnVar24 = local_240;
  for (; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pnVar24->m_backend).data._M_elems[0] = (pcVar23->data)._M_elems[0];
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar30 * -2 + 1) * 4);
    pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar24 + ((ulong)bVar30 * -2 + 1) * 4);
  }
  (local_240->m_backend).exp = local_2c8.exp;
  (local_240->m_backend).neg = local_2c8.neg;
  (local_240->m_backend).fpclass = local_2c8.fpclass;
  (local_240->m_backend).prec_elem = local_2c8.prec_elem;
  return local_41c;
}

Assistant:

int SPxFastRT<R>::minDelta(
   R& val,
   R& maxabs,
   UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i, sel;
   R x, y, max;
   R u, l;
   bool leaving = (this->m_type == SPxSolverBase<R>::LEAVE);
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   R mabs = maxabs;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();

   sel = -1;
   max = val;

   if(update.delta().isSetup())
   {
      const int* last = idx + update.delta().size();

      for(idx += start; idx < last; idx += incr)
      {
         i = *idx;
         x = upd[i];

         /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
         if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                        && this->thesolver->isBasic(i))))
            continue;

         if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
               && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
               == SPxBasisBase<R>::Desc::P_FIXED)
            continue;

         if(x > epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (x > mabs) ? x : mabs;
            l = low[i];

            if(l > R(-infinity))
            {
               y = l - vec[i];

               if(y >= 0)
                  x = - fastDelta / x;
               else
                  x = (y - fastDelta) / x;

               if(x > max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
         else if(x < -epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (-x > mabs) ? -x : mabs;
            u = up[i];

            if(u < R(infinity))
            {
               y = u - vec[i];

               if(y <= 0)
                  x = fastDelta / x;
               else
                  x = (y + fastDelta) / x;

               if(x > max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
      }
   }
   else
   {
      /* In this case, the indices of the semi-sparse VectorBase<R> update.delta() are not set up and are filled below. */
      int* l_idx = update.delta().altIndexMem();
      R* uval = update.delta().altValues();
      const R* uend = uval + update.dim();
      assert(uval == upd);

      for(i = 0; uval < uend; ++uval, ++i)
      {
         x = *uval;

         if(x != 0.0)
         {
            if(x >= -epsilonZero() && x <= epsilonZero())
            {
               *uval = 0.0;
               continue;
            }
            else
               *l_idx++ = i;

            /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
            if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                           && this->thesolver->isBasic(i))))
               continue;

            if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
                  && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
                  == SPxBasisBase<R>::Desc::P_FIXED)
               continue;


            if(x > epsilonZero())
            {
               mabs = (x > mabs) ? x : mabs;
               l = low[i];

               if(l > R(-infinity))
               {
                  y = l - vec[i];

                  if(y >= 0)
                     x = - fastDelta / x;
                  else
                     x = (y - fastDelta) / x;

                  if(x > max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
            else if(x < -epsilonZero())
            {
               mabs = (-x > mabs) ? -x : mabs;
               u = up[i];

               if(u < R(infinity))
               {
                  y = u - vec[i];

                  if(y <= 0)
                     x = fastDelta / x;
                  else
                     x = (y + fastDelta) / x;

                  if(x > max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
         }
      }

      update.delta().setSize(int(l_idx - update.delta().indexMem()));
      update.delta().forceSetup();
   }

   val = max;
   maxabs = mabs;

   return sel;
}